

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtherr.c
# Opt level: O0

int mtherr(char *name,int code)

{
  int local_14;
  int code_local;
  char *name_local;
  
  printf("\n%s ",name);
  if ((code < 1) || (local_14 = code, 6 < code)) {
    local_14 = 0;
  }
  merror = code;
  printf("%s error\n",ermsg[local_14]);
  return 0;
}

Assistant:

int mtherr( name, code )
char *name;
int code;
{

/* Display string passed by calling program,
 * which is supposed to be the name of the
 * function in which the error occurred:
 */
printf( "\n%s ", name );

/* Set global error message word */
merror = code;

/* Display error message defined
 * by the code argument.
 */
if( (code <= 0) || (code >= 7) )
	code = 0;
printf( "%s error\n", ermsg[code] );

/* Return to calling
 * program
 */
return( 0 );
}